

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

pboolean p_socket_listen(PSocket *socket,PError **error)

{
  pboolean pVar1;
  int iVar2;
  pint pVar3;
  PErrorIO code;
  char *message;
  
  if (socket == (PSocket *)0x0) {
    message = "Invalid input argument";
    code = P_ERROR_IO_INVALID_ARGUMENT;
    pVar3 = 0;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      return 0;
    }
    iVar2 = listen(socket->fd,socket->listen_backlog);
    if (-1 < iVar2) {
      socket->field_0x18 = socket->field_0x18 | 0x10;
      return 1;
    }
    pVar3 = p_error_get_last_net();
    code = p_error_get_io_from_system(pVar3);
    pVar3 = p_error_get_last_net();
    message = "Failed to call listen() on socket";
  }
  p_error_set_error_p(error,code,pVar3,message);
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_listen (PSocket	*socket,
		 PError		**error)
{
	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (P_UNLIKELY (listen (socket->fd, socket->listen_backlog) < 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call listen() on socket");
		return FALSE;
	}

	socket->listening = TRUE;
	return TRUE;
}